

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

void __thiscall BigInt::operator/=(BigInt *this,longlong *num)

{
  BigInt local_38;
  longlong *local_18;
  longlong *num_local;
  BigInt *this_local;
  
  local_18 = num;
  num_local = (longlong *)this;
  operator/(&local_38,this,*num);
  operator=(this,&local_38);
  ~BigInt(&local_38);
  return;
}

Assistant:

void operator/=(const long long &num) {
        *this = *this / num;
    }